

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall pg::RTLSolver::RTLSolver(RTLSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  RTLSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__RTLSolver_002c7ae8;
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tout);
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tv);
  std::vector<int,_std::allocator<int>_>::vector(&this->tpr);
  uintqueue::uintqueue(&this->pea_state);
  uintqueue::uintqueue(&this->pea_S);
  bitset::bitset(&this->pea_root);
  std::vector<int,_std::allocator<int>_>::vector(&this->tangle);
  uintqueue::uintqueue(&this->tangleto);
  bitset::bitset(&this->escapes);
  bitset::bitset(&this->R);
  bitset::bitset(&this->Z);
  bitset::bitset(&this->G);
  bitset::bitset(&this->S);
  bitset::bitset(&this->V);
  bitset::bitset(&this->W);
  uintqueue::uintqueue(&this->Q);
  this->onesided = false;
  return;
}

Assistant:

RTLSolver::RTLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}